

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileNameSanitizerFactory.cpp
# Opt level: O0

string * ApprovalTests::FileNameSanitizerFactory::defaultSanitizer(string *fileName)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  undefined8 in_RSI;
  string *in_RDI;
  char ch;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  stringstream result;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  string *__lhs;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8 [2];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  __lhs = in_RDI;
  ::std::__cxx11::stringstream::stringstream(local_198);
  local_1a8[0]._M_current = (char *)::std::__cxx11::string::begin();
  ::std::__cxx11::string::end();
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)__lhs,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    if (!bVar2) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(local_1a8);
    cVar1 = *pcVar3;
    in_stack_fffffffffffffe1f = isForbidden((char)((ulong)in_RSI >> 0x38));
    if ((bool)in_stack_fffffffffffffe1f) {
      ::std::operator<<(local_188,"_");
    }
    else {
      ::std::operator<<(local_188,cVar1);
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_1a8);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string FileNameSanitizerFactory::defaultSanitizer(std::string fileName)
    {
        std::stringstream result;
        for (auto ch : fileName)
        {
            if (!isForbidden(ch))
            {
                result << ch;
            }
            else
            {
                result << "_";
            }
        }
        return result.str();
    }